

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cpp
# Opt level: O1

void __thiscall Simulator::raiseError(Simulator *this,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char buf [8192];
  undefined8 local_20e8;
  void **local_20e0;
  undefined1 *local_20d8;
  undefined1 local_20c8 [16];
  undefined8 local_20b8;
  undefined8 local_20b0;
  undefined8 local_20a8;
  undefined8 local_20a0;
  undefined8 local_2098;
  undefined8 local_2088;
  undefined8 local_2078;
  undefined8 local_2068;
  undefined8 local_2058;
  undefined8 local_2048;
  undefined8 local_2038;
  undefined8 local_2028;
  char local_2018 [8192];
  
  local_20d8 = local_20c8;
  if (in_AL != '\0') {
    local_2098 = in_XMM0_Qa;
    local_2088 = in_XMM1_Qa;
    local_2078 = in_XMM2_Qa;
    local_2068 = in_XMM3_Qa;
    local_2058 = in_XMM4_Qa;
    local_2048 = in_XMM5_Qa;
    local_2038 = in_XMM6_Qa;
    local_2028 = in_XMM7_Qa;
  }
  local_20e0 = &args[0].overflow_arg_area;
  local_20e8 = 0x3000000010;
  local_20b8 = in_RDX;
  local_20b0 = in_RCX;
  local_20a8 = in_R8;
  local_20a0 = in_R9;
  vsprintf(local_2018,format,&local_20e8);
  fputs(local_2018,_stderr);
  dumpHistory(this);
  fwrite("Error! Please check dump.txt\n",0x1d,1,_stderr);
  exit(-1);
}

Assistant:

void Simulator::raiseError(const char *format, ...) {
    char buf[BUFSIZ];
    va_list args;
    va_start(args, format);
    vsprintf(buf, format, args);
    fprintf(stderr, "%s", buf);
    va_end(args);
    dumpHistory();
    fprintf(stderr, "Error! Please check dump.txt\n");
    exit(-1);
}